

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::GenericSchemaValidator
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                 *schemaDocument,CrtAllocator *allocator,size_t schemaStackCapacity,
          size_t documentStackCapacity)

{
  (this->
  super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
  )._vptr_ISchemaStateFactory = (_func_int **)&PTR__GenericSchemaValidator_00148a00;
  (this->super_ISchemaValidator)._vptr_ISchemaValidator =
       (_func_int **)&PTR__GenericSchemaValidator_00148bb0;
  (this->
  super_IValidationErrorHandler<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
  )._vptr_IValidationErrorHandler = (_func_int **)&PTR__GenericSchemaValidator_00148be8;
  this->schemaDocument_ = schemaDocument;
  this->root_ = schemaDocument->root_;
  this->stateAllocator_ = allocator;
  this->ownStateAllocator_ = (CrtAllocator *)0x0;
  (this->schemaStack_).allocator_ = allocator;
  (this->schemaStack_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->schemaStack_).stack_ = (char *)0x0;
  (this->schemaStack_).stackTop_ = (char *)0x0;
  (this->schemaStack_).stackEnd_ = (char *)0x0;
  (this->schemaStack_).initialCapacity_ = schemaStackCapacity;
  (this->documentStack_).allocator_ = allocator;
  (this->documentStack_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->documentStack_).stack_ = (char *)0x0;
  (this->documentStack_).stackTop_ = (char *)0x0;
  (this->documentStack_).stackEnd_ = (char *)0x0;
  (this->documentStack_).initialCapacity_ = documentStackCapacity;
  (this->error_).data_.s.str = (Ch *)0x0;
  this->outputHandler_ = (BaseReaderHandler<rapidjson::UTF8<char>,_void> *)0x0;
  (this->error_).data_.n = (Number)0x0;
  (this->error_).data_.f.flags = 3;
  (this->currentError_).data_.n = (Number)0x0;
  (this->currentError_).data_.s.str = (Ch *)0x0;
  (this->missingDependents_).data_.n = (Number)0x0;
  (this->missingDependents_).data_.s.str = (Ch *)0x0;
  this->valid_ = true;
  this->flags_ = 0;
  this->depth_ = 0;
  return;
}

Assistant:

GenericSchemaValidator(
        const SchemaDocumentType& schemaDocument,
        StateAllocator* allocator = 0, 
        size_t schemaStackCapacity = kDefaultSchemaStackCapacity,
        size_t documentStackCapacity = kDefaultDocumentStackCapacity)
        :
        schemaDocument_(&schemaDocument),
        root_(schemaDocument.GetRoot()),
        stateAllocator_(allocator),
        ownStateAllocator_(0),
        schemaStack_(allocator, schemaStackCapacity),
        documentStack_(allocator, documentStackCapacity),
        outputHandler_(0),
        error_(kObjectType),
        currentError_(),
        missingDependents_(),
        valid_(true),
        flags_(kValidateDefaultFlags),
        depth_(0)
    {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::GenericSchemaValidator");
    }